

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# t1_generate_luts.c
# Opt level: O3

int t1_init_spb(int f)

{
  uint uVar1;
  undefined4 in_ECX;
  int iVar2;
  undefined4 uVar3;
  undefined1 auVar4 [16];
  undefined1 auVar5 [16];
  undefined1 auVar6 [16];
  undefined1 auVar7 [16];
  int iVar8;
  
  iVar2 = -(uint)((f & 0x880U) == 0x80 || (f & 0x220U) == 0x20);
  iVar8 = -(uint)((f & 0x440U) == 0x40 || (f & 0x110U) == 0x10);
  auVar4._4_4_ = iVar2;
  auVar4._0_4_ = iVar2;
  auVar4._8_4_ = iVar8;
  auVar4._12_4_ = iVar8;
  auVar5._0_4_ = -(uint)((f & 0x880U) == 0x880 || (f & 0x220U) == 0x220);
  iVar2 = -(uint)((f & 0x440U) == 0x440 || (f & 0x110U) == 0x110);
  auVar5._4_4_ = auVar5._0_4_;
  auVar5._8_4_ = iVar2;
  auVar5._12_4_ = iVar2;
  iVar2 = movmskpd(in_ECX,auVar4 ^ auVar5);
  uVar1 = 0;
  if (iVar2 != 0) {
    auVar6._8_4_ = 0xffffffff;
    auVar6._0_8_ = 0xffffffffffffffff;
    auVar6._12_4_ = 0xffffffff;
    auVar6 = auVar5 | auVar4 ^ auVar6;
    auVar7._0_8_ = auVar6._0_8_ << 0x3f;
    auVar7._8_8_ = auVar6._8_8_ << 0x3f;
    uVar3 = movmskpd(iVar2,auVar7);
    uVar1 = (byte)(((byte)uVar3 >> 1 | SUB161(auVar4 ^ auVar5,0)) & (byte)uVar3) & 1;
  }
  return uVar1;
}

Assistant:

static int t1_init_spb(int f) {
	int hc, vc, n;

	hc = opj_int_min(((f & (T1_SIG_E | T1_SGN_E)) ==
				T1_SIG_E) + ((f & (T1_SIG_W | T1_SGN_W)) == T1_SIG_W),
			1) - opj_int_min(((f & (T1_SIG_E | T1_SGN_E)) ==
					(T1_SIG_E | T1_SGN_E)) +
				((f & (T1_SIG_W | T1_SGN_W)) ==
				 (T1_SIG_W | T1_SGN_W)), 1);

	vc = opj_int_min(((f & (T1_SIG_N | T1_SGN_N)) ==
				T1_SIG_N) + ((f & (T1_SIG_S | T1_SGN_S)) == T1_SIG_S),
			1) - opj_int_min(((f & (T1_SIG_N | T1_SGN_N)) ==
					(T1_SIG_N | T1_SGN_N)) +
				((f & (T1_SIG_S | T1_SGN_S)) ==
				 (T1_SIG_S | T1_SGN_S)), 1);

	if (!hc && !vc)
		n = 0;
	else
		n = (!(hc > 0 || (!hc && vc > 0)));

	return n;
}